

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::func_name
          (string *__return_storage_ptr__,t_netstd_generator *this,string *fname,
          bool suppress_mapping)

{
  undefined3 in_register_00000009;
  string sStack_38;
  
  if (CONCAT31(in_register_00000009,suppress_mapping) == 0) {
    std::__cxx11::string::string((string *)&sStack_38,(string *)fname);
    get_mapped_member_name(__return_storage_ptr__,this,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fname);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::func_name(std::string fname, bool suppress_mapping) {
  if (suppress_mapping) {
    return fname;
  }

  return get_mapped_member_name(fname);
}